

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O3

void duckdb::ArrayFixedCombine<float,duckdb::CrossProductOp,3ul>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *count;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  unsigned_long *puVar9;
  pointer pcVar10;
  BoundFunctionExpression *pBVar11;
  reference pvVar12;
  Vector *vector;
  Vector *vector_00;
  Vector *pVVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  InvalidInputException *pIVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idx;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_160;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  string local_100;
  string local_e0;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  pBVar11 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  count = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args->count;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector = ArrayVector::GetEntry(pvVar12);
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  vector_00 = ArrayVector::GetEntry(pvVar12);
  pVVar13 = ArrayVector::GetEntry(result);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  Vector::ToUnifiedFormat(pvVar12,(idx_t)count,&local_78);
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  Vector::ToUnifiedFormat(pvVar12,(idx_t)count,&local_c0);
  if (count != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pdVar6 = vector->data;
    pdVar7 = vector_00->data;
    pdVar8 = pVVar13->data;
    idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar14 = idx;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)(local_78.sel)->sel_vector[(long)idx];
      }
      params = idx;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)(local_c0.sel)->sel_vector[(long)idx];
      }
      if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)pbVar14 >> 6] >> ((ulong)pbVar14 & 0x3f) & 1) != 0)) &&
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [(ulong)params >> 6] >> ((ulong)params & 0x3f) & 1) != 0)))) {
        puVar9 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((ulong)((long)pbVar14 * 3) < 0xfffffffffffffffd && puVar9 != (unsigned_long *)0x0) {
          lVar16 = 0;
          do {
            uVar1 = (long)pbVar14 * 3 + lVar16;
            if ((puVar9[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
              pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_120[0] = local_110;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_120,"%s: left argument can not contain NULL values","");
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              pcVar10 = (pBVar11->function).super_BaseScalarFunction.super_SimpleFunction.
                        super_Function.name._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,pcVar10,
                         pcVar10 + (pBVar11->function).super_BaseScalarFunction.super_SimpleFunction
                                   .super_Function.name._M_string_length);
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_120,&local_e0,params);
              InvalidInputException::InvalidInputException(pIVar15,&local_160);
              __cxa_throw(pIVar15,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
        }
        params_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)params * 3);
        puVar9 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (params_00 <
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xfffffffffffffffd
            && puVar9 != (unsigned_long *)0x0) {
          lVar16 = 0;
          do {
            uVar1 = (long)&(params_00->_M_dataplus)._M_p + lVar16;
            if ((puVar9[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
              pIVar15 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_140[0] = local_130;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_140,"%s: right argument can not contain NULL values","");
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              pcVar10 = (pBVar11->function).super_BaseScalarFunction.super_SimpleFunction.
                        super_Function.name._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,pcVar10,
                         pcVar10 + (pBVar11->function).super_BaseScalarFunction.super_SimpleFunction
                                   .super_Function.name._M_string_length);
              StringUtil::Format<std::__cxx11::string>
                        (&local_160,(StringUtil *)local_140,&local_100,params_00);
              InvalidInputException::InvalidInputException(pIVar15,&local_160);
              __cxa_throw(pIVar15,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
        }
        fVar2 = *(float *)(pdVar6 + (long)pbVar14 * 0xc);
        fVar3 = *(float *)(pdVar7 + (long)params * 0xc);
        uVar4 = *(undefined8 *)(pdVar6 + (long)pbVar14 * 0xc + 4);
        uVar5 = *(undefined8 *)(pdVar7 + (long)params * 0xc + 4);
        fVar17 = (float)uVar4;
        fVar18 = (float)((ulong)uVar4 >> 0x20);
        fVar19 = (float)uVar5;
        fVar20 = (float)((ulong)uVar5 >> 0x20);
        *(ulong *)(pdVar8 + (long)idx * 0xc) =
             CONCAT44(fVar3 * fVar18 - fVar2 * fVar20,fVar20 * fVar17 - fVar18 * fVar19);
        *(float *)(pdVar8 + (long)idx * 0xc + 8) = fVar2 * fVar19 - fVar3 * fVar17;
      }
      else {
        FlatVector::SetNull(result,(idx_t)idx,true);
      }
      idx = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(idx->_M_dataplus)._M_p + 1);
    } while (idx != count);
    if (count == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001)
    {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ArrayFixedCombine(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);
	auto &res_child = ArrayVector::GetEntry(result);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(res_child);

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * N;
		if (!lhs_child_validity.CheckAllValid(left_offset + N, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * N;
		if (!rhs_child_validity.CheckAllValid(right_offset + N, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}
		const auto result_offset = i * N;

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;
		const auto res_data_ptr = res_data + result_offset;

		OP::Operation(lhs_data_ptr, rhs_data_ptr, res_data_ptr, N);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}